

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_id.c
# Opt level: O2

FUNCTION_RETURN getAdapterInfos(OsAdapterInfo *adapterInfos,size_t *adapter_info_size)

{
  char *__src;
  int iVar1;
  int iVar2;
  FUNCTION_RETURN FVar3;
  char *__ptr;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ifaddrs *piVar7;
  sockaddr *psVar8;
  ulong uVar9;
  char *__s2;
  ifaddrs *ifaddr;
  uchar *local_40;
  sockaddr *local_38;
  
  piVar7 = (ifaddrs *)&ifaddr;
  iVar1 = getifaddrs(piVar7);
  if (iVar1 == -1) {
    perror("getifaddrs");
    FVar3 = FUNC_RET_ERROR;
  }
  else {
    if (adapterInfos != (OsAdapterInfo *)0x0) {
      memset(adapterInfos,0,*adapter_info_size * 0x414);
    }
    iVar1 = 0;
    while (piVar7 = piVar7->ifa_next, piVar7 != (ifaddrs *)0x0) {
      iVar1 = (iVar1 + 1) - (uint)(piVar7->ifa_addr == (sockaddr *)0x0);
    }
    __ptr = (char *)calloc(1,(ulong)(uint)(iVar1 * 0x401));
    local_40 = adapterInfos->mac_address;
    piVar7 = (ifaddrs *)&ifaddr;
    uVar9 = 0;
    while( true ) {
      piVar7 = piVar7->ifa_next;
      iVar1 = (int)uVar9;
      if (piVar7 == (ifaddrs *)0x0) break;
      if (piVar7->ifa_addr != (sockaddr *)0x0) {
        __src = piVar7->ifa_name;
        uVar4 = 0;
        if (0 < iVar1) {
          uVar4 = uVar9;
        }
        __s2 = __ptr;
        local_38 = piVar7->ifa_addr;
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          iVar2 = strcmp(__src,__s2);
          psVar8 = local_38;
          if (iVar2 == 0) goto LAB_002046f1;
          __s2 = __s2 + 0x401;
        }
        strncpy(__ptr + (uint)(iVar1 * 0x401),__src,0x401);
        if (adapterInfos == (OsAdapterInfo *)0x0) {
          uVar9 = (ulong)(iVar1 + 1);
        }
        else {
          if (uVar9 < *adapter_info_size) {
            strncpy(adapterInfos[uVar9].description,piVar7->ifa_name,0x400);
          }
          uVar6 = uVar9;
          psVar8 = piVar7->ifa_addr;
          uVar9 = (ulong)(iVar1 + 1);
LAB_002046f1:
          uVar4 = (ulong)(int)uVar6;
          if (psVar8->sa_family == 0x11) {
            if (((adapterInfos != (OsAdapterInfo *)0x0) && (piVar7->ifa_data != (void *)0x0)) &&
               (uVar4 < *adapter_info_size)) {
              for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
                local_40[lVar5 + uVar4 * 0x414] = psVar8->sa_data[lVar5 + 10];
              }
            }
          }
          else if (((psVar8->sa_family == 2) && (adapterInfos != (OsAdapterInfo *)0x0)) &&
                  (uVar4 < *adapter_info_size)) {
            *(undefined4 *)adapterInfos[uVar4].ipv4_address = *(undefined4 *)(psVar8->sa_data + 2);
          }
        }
      }
    }
    *adapter_info_size = uVar9;
    freeifaddrs(ifaddr);
    free(__ptr);
    FVar3 = FUNC_RET_OK;
  }
  return FVar3;
}

Assistant:

FUNCTION_RETURN getAdapterInfos(OsAdapterInfo * adapterInfos,
		size_t * adapter_info_size) {

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0, if_name_position;
	unsigned int if_num, if_max;
	//char host[NI_MAXHOST];
	char *ifnames;

	if (getifaddrs(&ifaddr) == -1) {
		perror("getifaddrs");
		return FUNC_RET_ERROR;
	}

	if (adapterInfos != NULL) {
		memset(adapterInfos, 0, (*adapter_info_size) * sizeof(OsAdapterInfo));
	}

	/* count the maximum number of interfaces */
	for (ifa = ifaddr, if_max = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL) {
			continue;
		}
		if_max++;
	}

	/* allocate space for names */
	ifnames = (char*) malloc(NI_MAXHOST * if_max);
	memset(ifnames, 0, NI_MAXHOST * if_max);
	/* Walk through linked list, maintaining head pointer so we
	 can free list later */
	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL;
			ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL) {
			continue;
		}
		if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		//interface name not seen en advance
		if (if_name_position < 0) {
			strncpy(&ifnames[if_num * NI_MAXHOST], ifa->ifa_name, NI_MAXHOST);
			if (adapterInfos != NULL && if_num < *adapter_info_size) {
				strncpy(adapterInfos[if_num].description, ifa->ifa_name,
				NI_MAXHOST-1);
			}
			if_name_position = if_num;
			if_num++;
			if (adapterInfos == NULL) {
				continue;
			}
		}
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
#ifdef _DEBUG
		printf("%-8s %s (%d)\n", ifa->ifa_name,
				(family == AF_PACKET) ? "AF_PACKET" :
				(family == AF_INET) ? "AF_INET" :
				(family == AF_INET6) ? "AF_INET6" : "???", family);
#endif
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			/*
			 s = getnameinfo(ifa->ifa_addr,
			 (family == AF_INET) ?
			 sizeof(struct sockaddr_in) :
			 sizeof(struct sockaddr_in6), host, NI_MAXHOST,
			 NULL, 0, NI_NUMERICHOST);

			 #ifdef _DEBUG
			 s = getnameinfo(ifa->ifa_addr, sizeof(struct sockaddr_in), host,
			 NI_MAXHOST,
			 NULL, 0, NI_NUMERICHOST);
			 if (s != 0) {
			 printf("getnameinfo() failed: %s\n", gai_strerror(s));
			 }
			 printf("\t\taddress: <%s>\n", host);
			 #endif
			 */
			if (adapterInfos != NULL && if_name_position < *adapter_info_size) {
				struct sockaddr_in *s1 = (struct sockaddr_in*) ifa->ifa_addr;
				in_addr_t iaddr = s1->sin_addr.s_addr;
				adapterInfos[if_name_position].ipv4_address[0] = (iaddr
						& 0x000000ff);
				adapterInfos[if_name_position].ipv4_address[1] = (iaddr
						& 0x0000ff00) >> 8;
				adapterInfos[if_name_position].ipv4_address[2] = (iaddr
						& 0x00ff0000) >> 16;
				adapterInfos[if_name_position].ipv4_address[3] = (iaddr
						& 0xff000000) >> 24;
			}
		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll*) ifa->ifa_addr;
			if (adapterInfos != NULL && if_name_position < *adapter_info_size) {
				for (int i = 0; i < 6; i++) {
					adapterInfos[if_name_position].mac_address[i] =
							s1->sll_addr[i];
#ifdef _DEBUG
					printf("%02x:", s1->sll_addr[i]);
#endif
				}
#ifdef _DEBUG
				printf("\t %s\n", ifa->ifa_name);
#endif

			}
		}
	}

	*adapter_info_size = if_num;
	if (adapterInfos == NULL) {
		f_return = FUNC_RET_OK;
	} else if (*adapter_info_size < if_num) {
		f_return = FUNC_RET_BUFFER_TOO_SMALL;
	}
	freeifaddrs(ifaddr);
	free(ifnames);
	return f_return;
}